

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openrpg.cpp
# Opt level: O2

int parse_args(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  string *this;
  allocator local_1fa;
  allocator local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  int opt_ind;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  NameGenerator name;
  
  opt_ind = 0;
LAB_00103b3d:
  iVar2 = ORPG::Core::getopt_long(argc,argv,"hn:qr:vV",parse_args::long_opts,&opt_ind);
  switch(iVar2) {
  case 0x6e:
    break;
  case 0x6f:
  case 0x70:
  case 0x73:
  case 0x74:
  case 0x75:
switchD_00103b7b_caseD_6f:
    fwrite("Aborting...\n",0xc,1,_stderr);
    exit(1);
  case 0x71:
    ORPG::Core::QUIET_FLAG._0_1_ = 1;
    ORPG::Core::VB_FLAG._0_1_ = 0;
    goto LAB_00103b3d;
  case 0x72:
    ORPG::ExpressionTree::ExpressionTree((ExpressionTree *)&name);
    std::__cxx11::string::string(local_1d0,ORPG::Core::optarg,(allocator *)&local_1f8);
    ORPG::ExpressionTree::set_expression(&name,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    uVar3 = ORPG::ExpressionTree::parse_expression((ExpressionTree *)&name);
    printf("%i\n",(ulong)uVar3);
    goto LAB_00103c94;
  case 0x76:
    ORPG::Core::VB_FLAG._0_1_ = 1;
    ORPG::Core::QUIET_FLAG._0_1_ = 0;
    goto LAB_00103b3d;
  default:
    if ((iVar2 == 0x3a) || (iVar2 == 0x3f)) {
LAB_00103b6c:
      ORPG::Core::PRINT_HELP_FLAG();
    }
    else {
      if (iVar2 != 0x56) {
        if (iVar2 != 0x68) {
          if (iVar2 == -1) {
            return -2;
          }
          goto switchD_00103b7b_caseD_6f;
        }
        goto LAB_00103b6c;
      }
      ORPG::Core::PRINT_VERSION_FLAG();
    }
    goto LAB_00103b3d;
  }
  std::__cxx11::string::string(local_f0,"dwarf",(allocator *)&local_1f8);
  std::__cxx11::string::string(local_110,"",(allocator *)&local_d0);
  ORPG::NameGenerator::NameGenerator(&name,local_f0,local_110);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_f0);
  if (ORPG::Core::optind < argc) {
    std::__cxx11::string::string((string *)&local_1f8,ORPG::Core::optarg,&local_1f9);
    bVar1 = std::operator==(&local_1f8,"male");
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    else {
      std::__cxx11::string::string((string *)&local_d0,ORPG::Core::optarg,&local_1fa);
      bVar1 = std::operator==(&local_d0,"female");
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_1f8);
      if (!bVar1) {
        std::__cxx11::string::string(local_170,ORPG::Core::optarg,(allocator *)&local_1f8);
        ORPG::NameGenerator::set_race(&name,local_170);
        std::__cxx11::string::~string(local_170);
        lVar4 = (long)ORPG::Core::optind;
        ORPG::Core::optind = ORPG::Core::optind + 1;
        std::__cxx11::string::string(local_190,argv[lVar4],(allocator *)&local_1f8);
        ORPG::NameGenerator::set_gender(&name,local_190);
        this = local_190;
        goto LAB_00103e06;
      }
    }
    std::__cxx11::string::string(local_130,ORPG::Core::optarg,(allocator *)&local_1f8);
    ORPG::NameGenerator::set_gender(&name,local_130);
    std::__cxx11::string::~string(local_130);
    lVar4 = (long)ORPG::Core::optind;
    ORPG::Core::optind = ORPG::Core::optind + 1;
    std::__cxx11::string::string(local_150,argv[lVar4],(allocator *)&local_1f8);
    ORPG::NameGenerator::set_race(&name,local_150);
    this = local_150;
  }
  else {
    if (ORPG::Core::optind != argc) {
      fwrite("Error: invalid number of args (expects 1 or 2)\n",0x2f,1,_stderr);
      ORPG::Core::PRINT_HELP_FLAG();
      goto LAB_00103c6d;
    }
    std::__cxx11::string::string(local_1b0,ORPG::Core::optarg,(allocator *)&local_1f8);
    ORPG::NameGenerator::set_race(&name,local_1b0);
    this = local_1b0;
  }
LAB_00103e06:
  std::__cxx11::string::~string(this);
LAB_00103c6d:
  ORPG::NameGenerator::make_name_abi_cxx11_();
  puts(local_1f8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1f8);
LAB_00103c94:
  exit(0);
}

Assistant:

int parse_args(int argc, char* argv[]) {
    /* getopt_long stores the option and option index here */
    int opt = 0, opt_ind = 0;

    /* these are the long cla's and their corresponding chars */
    static struct Core::option long_opts[] = {
        {"help",    no_argument,        0,  'h'},
        {"name",    required_argument,  0,  'n'},
        {"quiet",   no_argument,        0,  'q'},
        {"roll",    required_argument,  0,  'r'},
        {"verbose", no_argument,        0,  'v'},
        {"version", no_argument,        0,  'V'},
        /* NULL row to terminate struct */
        {0,         0,                  0,   0}
    };

    while ((opt = getopt_long(argc, argv, "hn:qr:vV", long_opts, &opt_ind))
			!= EOF) {
        switch (opt) {
			/* -h --help */
			case 'h': {
				Core::PRINT_HELP_FLAG();
			} break;

			/* -n --name */
			case 'n': {
				NameGenerator name;

				if(Core::optind < argc) {
					if((string)Core::optarg == "male" || (string)Core::optarg == "female") {
                        name.set_gender((string)Core::optarg);
						name.set_race((string)argv[Core::optind++]);
					} else {
						name.set_race((string)Core::optarg);
						name.set_gender((string)argv[Core::optind++]);
					}
				} else if(Core::optind == argc) {
					name.set_race((string)Core::optarg);
				} else {
					fprintf(stderr, "Error: invalid number of args (expects 1 or 2)\n");
					Core::PRINT_HELP_FLAG();
				}
				printf("%s\n", name.make_name().c_str());
				exit(EXIT_SUCCESS);
			} break;

			/* -q --quiet */
			case 'q': {
				Core::QUIET_FLAG = true;
				Core::VB_FLAG = false;
			} break;

			/* -r --roll */
			case 'r': {
				ExpressionTree tree;
				tree.set_expression(Core::optarg);
				printf("%i\n", tree.parse_expression());
				exit(EXIT_SUCCESS);
			} break;

			/* -v --verbose */
			case 'v': {
				Core::VB_FLAG = true;
				Core::QUIET_FLAG = false;
			} break;

			/* -V --version */
			case 'V': {
				Core::PRINT_VERSION_FLAG();
			} break;

			case ':':
			case '?': {
				Core::PRINT_HELP_FLAG();
			} break;

			/* if we get here something very bad happened */
			default: {
				fprintf(stderr, "Aborting...\n");
				exit(EXIT_FAILURE);
			}
        }
    }

    return CONTINUE_CODE;
}